

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall leveldb::Arena::~Arena(Arena *this)

{
  pointer ppcVar1;
  ulong uVar2;
  
  ppcVar1 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar1) {
    uVar2 = 0;
    do {
      if (ppcVar1[uVar2] != (char *)0x0) {
        operator_delete__(ppcVar1[uVar2]);
      }
      uVar2 = uVar2 + 1;
      ppcVar1 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->blocks_).
                                   super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3));
  }
  if (ppcVar1 != (pointer)0x0) {
    operator_delete(ppcVar1);
    return;
  }
  return;
}

Assistant:

Arena::~Arena() {
  for (size_t i = 0; i < blocks_.size(); i++) {
    delete[] blocks_[i];
  }
}